

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
               (CodedInputStream *input,int *value)

{
  bool bVar1;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp;
  int *value_local;
  CodedInputStream *input_local;
  
  puStack_20 = (uint32 *)value;
  value_local = (int *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_24);
  if (bVar1) {
    *puStack_20 = local_24;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
    io::CodedInputStream* input,
    int* value) {
  uint32 temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = static_cast<int>(temp);
  return true;
}